

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O2

void __thiscall
checkqueue_tests::test_CheckQueue_Catches_Failure::test_method
          (test_CheckQueue_Catches_Failure *this)

{
  long lVar1;
  readonly_property<bool> rVar2;
  int iVar3;
  ulong __n;
  iterator in_R8;
  iterator in_R9;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  check_type cVar7;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  assertion_result local_88;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  __single_object fail_queue;
  CCheckQueueControl<FailingCheck> control;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<FailingCheck>,unsigned_int_const&,int_const&>
            ((uint *)&fail_queue,(int *)&QUEUE_BATCH_SIZE);
  for (uVar6 = 0; uVar6 != 0x3e9; uVar6 = uVar6 + 1) {
    CCheckQueueControl<FailingCheck>::CCheckQueueControl
              (&control,(CCheckQueue<FakeCheckCheckCompletion> *)
                        fail_queue._M_t.
                        super___uniq_ptr_impl<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_CCheckQueue<FailingCheck>_*,_std::default_delete<CCheckQueue<FailingCheck>_>_>
                        .super__Head_base<0UL,_CCheckQueue<FailingCheck>_*,_false>._M_head_impl);
    for (uVar5 = uVar6; uVar5 != 0; uVar5 = uVar5 - uVar4) {
      iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                        (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_NoLockLoggingTestingSetup
                          .super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
                          super_RandomMixin<FastRandomContext>,10);
      __n = (ulong)iVar3;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<FailingCheck,_std::allocator<FailingCheck>_>::reserve
                ((vector<FailingCheck,_std::allocator<FailingCheck>_> *)&vChecks,__n);
      if (uVar5 < __n) {
        __n = uVar5;
      }
      for (uVar4 = 0; __n != uVar4; uVar4 = uVar4 + 1) {
        local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(uVar5 - 1 == uVar4);
        std::vector<FailingCheck,_std::allocator<FailingCheck>_>::emplace_back<bool>
                  ((vector<FailingCheck,_std::allocator<FailingCheck>_> *)&vChecks,(bool *)&local_88
                  );
      }
      CCheckQueueControl<FailingCheck>::Add(&control,&vChecks);
      std::_Vector_base<FailingCheck,_std::allocator<FailingCheck>_>::~_Vector_base
                ((_Vector_base<FailingCheck,_std::allocator<FailingCheck>_> *)&vChecks);
    }
    rVar2.super_class_property<bool>.value =
         (class_property<bool>)CCheckQueueControl<FailingCheck>::Wait(&control);
    if (uVar6 == 0) {
      local_d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_d0 = "";
      local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_00.m_end = in_R9;
      msg_00.m_begin = in_R8;
      file_00.m_end = (iterator)0xf0;
      file_00.m_begin = (iterator)&local_d8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e8,
                 msg_00);
      local_88.m_message.px = (element_type *)0x0;
      local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b8 = "success";
      local_b0 = "";
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)vChecks.
                            super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)boost::unit_test::lazy_ostream::inst;
      local_f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_f0 = "";
      in_R8 = (iterator)0x2;
      in_R9 = (iterator)0x0;
      local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                (&local_88,(lazy_ostream *)&vChecks,2,0,WARN,_cVar7,(size_t)&local_f8,0xf0);
    }
    else {
      local_60 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_58 = "";
      local_70 = &boost::unit_test::basic_cstring<char_const>::null;
      local_68 = &boost::unit_test::basic_cstring<char_const>::null;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      file.m_end = (iterator)0xee;
      file.m_begin = (iterator)&local_60;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,msg);
      local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)!(bool)rVar2.super_class_property<bool>.value;
      local_88.m_message.px = (element_type *)0x0;
      local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b8 = "!success";
      local_b0 = "";
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)vChecks.
                            super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)boost::unit_test::lazy_ostream::inst;
      local_c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_c0 = "";
      in_R8 = (iterator)0x2;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_88,(lazy_ostream *)&vChecks,2,0,WARN,_cVar7,(size_t)&local_c8,0xee);
    }
    boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
    CCheckQueueControl<FailingCheck>::~CCheckQueueControl(&control);
  }
  std::unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>::
  ~unique_ptr(&fail_queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Catches_Failure)
{
    auto fail_queue = std::make_unique<Failing_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    for (size_t i = 0; i < 1001; ++i) {
        CCheckQueueControl<FailingCheck> control(fail_queue.get());
        size_t remaining = i;
        while (remaining) {
            size_t r = m_rng.randrange(10);

            std::vector<FailingCheck> vChecks;
            vChecks.reserve(r);
            for (size_t k = 0; k < r && remaining; k++, remaining--)
                vChecks.emplace_back(remaining == 1);
            control.Add(std::move(vChecks));
        }
        bool success = control.Wait();
        if (i > 0) {
            BOOST_REQUIRE(!success);
        } else if (i == 0) {
            BOOST_REQUIRE(success);
        }
    }
}